

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLuint __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetBaseAlignment(Type *this,bool is_array)

{
  GLuint local_20;
  GLuint alignment;
  GLuint N;
  GLuint elements;
  bool is_array_local;
  Type *this_local;
  
  alignment = 1;
  if (this->m_n_rows == 2) {
    alignment = 2;
  }
  else if (this->m_n_rows - 3 < 2) {
    alignment = 4;
  }
  local_20 = GetTypeSize(this->m_basic_type);
  local_20 = local_20 * alignment;
  if ((is_array) || (this->m_n_columns != 1)) {
    local_20 = Utils::align(local_20,0x10);
  }
  return local_20;
}

Assistant:

GLuint Type::GetBaseAlignment(bool is_array) const
{
	GLuint elements = 1;

	switch (m_n_rows)
	{
	case 2:
		elements = 2;
		break;
	case 3:
	case 4:
		elements = 4;
		break;
	default:
		break;
	}

	GLuint N		 = GetTypeSize(m_basic_type);
	GLuint alignment = N * elements;

	if ((true == is_array) || (1 != m_n_columns))
	{
		alignment = align(alignment, 16 /* vec4 alignment */);
	}

	return alignment;
}